

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall
ctemplate::SectionTemplateNode::DumpToString(SectionTemplateNode *this,int level,string *out)

{
  _List_node_base *p_Var1;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  if (out != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_50,"Section Start: ",&local_71);
    std::__cxx11::string::string((string *)&local_70,"\n",&local_72);
    AppendTokenWithIndent(level,out,&local_50,&this->token_,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    p_Var1 = (_List_node_base *)&this->node_list_;
    while (p_Var1 = (((_List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>
                       *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var1 != (_List_node_base *)&this->node_list_) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 0x20))(p_Var1[1]._M_next,level + 1,out);
    }
    std::__cxx11::string::string((string *)&local_50,"Section End: ",&local_71);
    std::__cxx11::string::string((string *)&local_70,"\n",&local_72);
    AppendTokenWithIndent(level,out,&local_50,&this->token_,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x5f1,
                "virtual void ctemplate::SectionTemplateNode::DumpToString(int, string *) const");
}

Assistant:

void SectionTemplateNode::DumpToString(int level, string *out) const {
  assert(out);
  AppendTokenWithIndent(level, out, "Section Start: ", token_, "\n");
  NodeList::const_iterator iter = node_list_.begin();
  for (; iter != node_list_.end(); ++iter) {
    (*iter)->DumpToString(level + 1, out);
  }
  AppendTokenWithIndent(level, out, "Section End: ", token_, "\n");
}